

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_soup_mesh_builder.cc
# Opt level: O0

int __thiscall
draco::TriangleSoupMeshBuilder::AddAttribute
          (TriangleSoupMeshBuilder *this,Type attribute_type,int8_t num_components,
          DataType data_type,bool normalized)

{
  int32_t iVar1;
  int iVar2;
  value_type *__x;
  pointer this_00;
  DataType in_ECX;
  char in_DL;
  undefined4 in_ESI;
  GeometryAttribute *in_RDI;
  undefined1 in_R8B;
  GeometryAttribute va;
  GeometryAttribute *in_stack_ffffffffffffff70;
  vector<signed_char,_std::allocator<signed_char>_> *this_01;
  DataType in_stack_ffffffffffffff78;
  uint8_t in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar3;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  ValueType in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 identity_mapping;
  GeometryAttribute *in_stack_ffffffffffffffb0;
  PointCloud *in_stack_ffffffffffffffb8;
  
  GeometryAttribute::GeometryAttribute(in_stack_ffffffffffffff70);
  uVar3 = CONCAT13(in_R8B,(int3)in_stack_ffffffffffffff80) & 0x1ffffff;
  iVar1 = DataTypeLength(in_ECX);
  __x = (value_type *)(long)(iVar1 * in_DL);
  this_01 = (vector<signed_char,_std::allocator<signed_char>_> *)0x0;
  GeometryAttribute::Init
            (in_RDI,in_ECX,(DataBuffer *)CONCAT44(in_ESI,uVar3),in_stack_ffffffffffffff7f,
             in_stack_ffffffffffffff78,false,
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  identity_mapping = (undefined1)((uint)in_stack_ffffffffffffffac >> 0x18);
  std::vector<signed_char,_std::allocator<signed_char>_>::push_back(this_01,__x);
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::operator->
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)0x1bcfa4);
  this_00 = std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::operator->
                      ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)0x1bcfb7);
  PointCloud::num_points(&this_00->super_PointCloud);
  iVar2 = PointCloud::AddAttribute
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(bool)identity_mapping,
                     in_stack_ffffffffffffffa8);
  return iVar2;
}

Assistant:

int TriangleSoupMeshBuilder::AddAttribute(
    GeometryAttribute::Type attribute_type, int8_t num_components,
    DataType data_type, bool normalized) {
  GeometryAttribute va;
  va.Init(attribute_type, nullptr, num_components, data_type, normalized,
          DataTypeLength(data_type) * num_components, 0);
  attribute_element_types_.push_back(-1);
  return mesh_->AddAttribute(va, true, mesh_->num_points());
}